

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void delta_encode_palette_colors(int *colors,int num,int bit_depth,int min_val,aom_writer *w)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int i;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int deltas [8];
  
  if (0 < num) {
    aom_write_literal(w,*colors,bit_depth);
    if (num != 1) {
      deltas[4] = 0;
      deltas[5] = 0;
      deltas[6] = 0;
      deltas[7] = 0;
      deltas[0] = 0;
      deltas[1] = 0;
      deltas[2] = 0;
      deltas[3] = 0;
      iVar7 = 0;
      for (lVar3 = 0; (ulong)(uint)num - 1 != lVar3; lVar3 = lVar3 + 1) {
        iVar4 = colors[lVar3 + 1] - colors[lVar3];
        deltas[lVar3] = iVar4;
        if (iVar7 < iVar4) {
          iVar7 = iVar4;
        }
      }
      iVar4 = bit_depth + -3;
      uVar2 = iVar7 - min_val;
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar7 = (uVar1 ^ 0xffffffe0) + 0x21;
      if ((int)(uVar2 + 1) < 2) {
        iVar7 = 0;
      }
      if (iVar7 <= iVar4) {
        iVar7 = iVar4;
      }
      iVar6 = (1 << ((byte)bit_depth & 0x1f)) - (*colors + min_val);
      aom_write_literal(w,iVar7 - iVar4,2);
      for (uVar5 = 0; num - 1 != uVar5; uVar5 = uVar5 + 1) {
        iVar4 = deltas[uVar5];
        aom_write_literal(w,iVar4 - min_val,iVar7);
        iVar6 = iVar6 - iVar4;
        uVar1 = 0x1f;
        if (iVar6 - 1U != 0) {
          for (; iVar6 - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        iVar4 = (uVar1 ^ 0xffffffe0) + 0x21;
        if (iVar6 < 2) {
          iVar4 = 0;
        }
        if (iVar4 <= iVar7) {
          iVar7 = iVar4;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void delta_encode_palette_colors(const int *colors, int num,
                                               int bit_depth, int min_val,
                                               aom_writer *w) {
  if (num <= 0) return;
  assert(colors[0] < (1 << bit_depth));
  aom_write_literal(w, colors[0], bit_depth);
  if (num == 1) return;
  int max_delta = 0;
  int deltas[PALETTE_MAX_SIZE];
  memset(deltas, 0, sizeof(deltas));
  for (int i = 1; i < num; ++i) {
    assert(colors[i] < (1 << bit_depth));
    const int delta = colors[i] - colors[i - 1];
    deltas[i - 1] = delta;
    assert(delta >= min_val);
    if (delta > max_delta) max_delta = delta;
  }
  const int min_bits = bit_depth - 3;
  int bits = AOMMAX(av1_ceil_log2(max_delta + 1 - min_val), min_bits);
  assert(bits <= bit_depth);
  int range = (1 << bit_depth) - colors[0] - min_val;
  aom_write_literal(w, bits - min_bits, 2);
  for (int i = 0; i < num - 1; ++i) {
    aom_write_literal(w, deltas[i] - min_val, bits);
    range -= deltas[i];
    bits = AOMMIN(bits, av1_ceil_log2(range));
  }
}